

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

void __thiscall
flatbuffers::java::JavaGenerator::GenUnionUnPack_ObjectAPI
          (JavaGenerator *this,EnumDef *enum_def,string *code,string *type_name,string *field_name,
          bool is_vector)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  pointer pcVar4;
  EnumVal *v;
  long *plVar5;
  ulong uVar6;
  undefined8 *puVar7;
  pointer ppEVar8;
  long *plVar9;
  size_type *psVar10;
  ulong *puVar11;
  char *pcVar12;
  undefined8 uVar13;
  int iVar14;
  undefined7 in_register_00000089;
  pointer ppEVar15;
  char *pcVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string actual_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string indent;
  string variable_name;
  string type_params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string value_params;
  string variable_type;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  string local_228;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string *local_188;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0 [2];
  long local_b0 [2];
  string *local_a0;
  EnumDef *local_98;
  JavaGenerator *local_90;
  string local_88;
  int local_64;
  Namer *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  iVar14 = (int)CONCAT71(in_register_00000089,is_vector);
  local_188 = code;
  local_a0 = field_name;
  local_98 = enum_def;
  local_90 = this;
  if (iVar14 == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar4 = (type_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar4,pcVar4 + type_name->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)type_name);
  }
  paVar2 = &local_180.field_2;
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"o","");
  local_60 = &(local_90->namer_).super_Namer;
  Namer::Variable(&local_88,local_60,&local_180,local_a0);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x36223c);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_d0 = *plVar9;
    lStack_c8 = plVar5[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar9;
    local_e0 = (long *)*plVar5;
  }
  local_d8 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar16 = "";
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_140.field_2._M_allocated_capacity = *psVar10;
    local_140.field_2._8_8_ = plVar5[3];
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar10;
    local_140._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = "_j";
  if (!is_vector) {
    pcVar12 = "";
  }
  uVar6 = (ulong)is_vector;
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar12,pcVar12 + uVar6 * 2);
  if (is_vector) {
    pcVar16 = ", _j";
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar16,pcVar16 + uVar6 * 4);
  pcVar16 = "    ";
  if (is_vector) {
    pcVar16 = "      ";
  }
  local_180._M_dataplus._M_p = (pointer)paVar2;
  local_64 = iVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,pcVar16,pcVar16 + uVar6 * 2 + 4);
  std::operator+(&local_1a8,&local_180,&local_58);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
    local_1c8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
    local_1c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1c8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1c8,(ulong)local_140._M_dataplus._M_p);
  paVar2 = &local_1e8.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1e8.field_2._M_allocated_capacity = *psVar10;
    local_1e8.field_2._8_8_ = plVar5[3];
    local_1e8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar10;
    local_1e8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1e8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_1f8 = *puVar11;
    lStack_1f0 = plVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar11;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_58._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_238 = *plVar9;
    lStack_230 = plVar5[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar9;
    local_248 = (long *)*plVar5;
  }
  local_240 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  paVar1 = &local_228.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar5[3];
    local_228._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_228._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  BVar3 = (local_98->underlying_type).base_type;
  uVar6 = 7;
  if ((((ulong)BVar3 != 4) && (BVar3 != BASE_TYPE_USHORT)) &&
     (uVar6 = (ulong)BVar3, BVar3 == BASE_TYPE_UINT)) {
    uVar6 = 9;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::java_typename + uVar6 * 8
                       ),(allocator<char> *)local_c0);
  plVar5 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_100,0,(char *)0x0,(ulong)local_180._M_dataplus._M_p);
  local_120 = &local_110;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_110 = *plVar9;
    lStack_108 = plVar5[3];
  }
  else {
    local_110 = *plVar9;
    local_120 = (long *)*plVar5;
  }
  local_118 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160.field_2._8_8_ = plVar5[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_1a8.field_2._M_allocated_capacity = *puVar11;
    local_1a8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *puVar11;
    local_1a8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1a8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_1c8.field_2._M_allocated_capacity = *puVar11;
    local_1c8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *puVar11;
    local_1c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1c8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)(local_a0->_M_dataplus)._M_p);
  puVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_1e8.field_2._M_allocated_capacity = *puVar11;
    local_1e8.field_2._8_8_ = puVar7[3];
    local_1e8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *puVar11;
    local_1e8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1e8._M_string_length = puVar7[1];
  *puVar7 = puVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_1f8 = *puVar11;
    lStack_1f0 = plVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar11;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_e0);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_238 = *plVar9;
    lStack_230 = plVar5[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar9;
    local_248 = (long *)*plVar5;
  }
  local_240 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar5[3];
    local_228._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_228._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  std::operator+(&local_1e8,&local_180,&local_140);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_1f8 = *puVar11;
    lStack_1f0 = plVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar11;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_140._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_238 = *plVar9;
    lStack_230 = plVar5[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar9;
    local_248 = (long *)*plVar5;
  }
  local_240 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar5[3];
    local_228._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_228._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_208);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_140._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_238 = *plVar9;
    lStack_230 = plVar5[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar9;
    local_248 = (long *)*plVar5;
  }
  local_240 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar5[3];
    local_228._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_228._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_208);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_140._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_238 = *plVar9;
    lStack_230 = plVar5[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar9;
    local_248 = (long *)*plVar5;
  }
  local_240 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar5[3];
    local_228._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_228._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  ppEVar15 = (local_98->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar8 = (local_98->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar15 != ppEVar8) {
    local_38 = &local_90->package_prefix_;
    do {
      v = *ppEVar15;
      BVar3 = (v->union_type).base_type;
      if (((BVar3 != BASE_TYPE_NONE) && (BVar3 != BASE_TYPE_STRING)) &&
         ((BVar3 != BASE_TYPE_STRUCT || (((v->union_type).struct_def)->fixed == false)))) {
        local_208 = &local_1f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)&local_208);
        IdlNamer::NamespacedEnumVariant_abi_cxx11_(&local_1c8,(IdlNamer *)local_60,local_98,v);
        std::operator+(&local_1e8,local_38,&local_1c8);
        uVar6 = 0xf;
        if (local_208 != &local_1f8) {
          uVar6 = local_1f8;
        }
        if (uVar6 < local_1e8._M_string_length + local_200) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            uVar13 = local_1e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_1e8._M_string_length + local_200) goto LAB_00235b68;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_208);
        }
        else {
LAB_00235b68:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_1e8._M_dataplus._M_p);
        }
        local_248 = &local_238;
        plVar5 = puVar7 + 2;
        if ((long *)*puVar7 == plVar5) {
          local_238 = *plVar5;
          lStack_230 = puVar7[3];
        }
        else {
          local_238 = *plVar5;
          local_248 = (long *)*puVar7;
        }
        local_240 = puVar7[1];
        *puVar7 = plVar5;
        puVar7[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_228.field_2._M_allocated_capacity = *psVar10;
          local_228.field_2._8_8_ = plVar5[3];
        }
        else {
          local_228.field_2._M_allocated_capacity = *psVar10;
          local_228._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_228._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        GenTypeGet_abi_cxx11_(&local_228,local_90,&v->union_type);
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c0,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)local_c0);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_c0,(ulong)local_140._M_dataplus._M_p);
        local_100 = &local_f0;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_f0 = *plVar9;
          lStack_e8 = plVar5[3];
        }
        else {
          local_f0 = *plVar9;
          local_100 = (long *)*plVar5;
        }
        local_f8 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_120 = &local_110;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_110 = *plVar9;
          lStack_108 = plVar5[3];
        }
        else {
          local_110 = *plVar9;
          local_120 = (long *)*plVar5;
        }
        local_118 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_120,(ulong)(local_a0->_M_dataplus)._M_p);
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_160.field_2._M_allocated_capacity = *psVar10;
          local_160.field_2._8_8_ = plVar5[3];
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar10;
          local_160._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_160._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1a8.field_2._M_allocated_capacity = *psVar10;
          local_1a8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar10;
          local_1a8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1a8,(ulong)local_228._M_dataplus._M_p);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1c8.field_2._M_allocated_capacity = *psVar10;
          local_1c8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *psVar10;
          local_1c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1c8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1e8.field_2._M_allocated_capacity = *psVar10;
          local_1e8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1e8.field_2._M_allocated_capacity = *psVar10;
          local_1e8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1e8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1e8,(ulong)local_88._M_dataplus._M_p);
        local_208 = &local_1f8;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar11) {
          local_1f8 = *puVar11;
          lStack_1f0 = plVar5[3];
        }
        else {
          local_1f8 = *puVar11;
          local_208 = (ulong *)*plVar5;
        }
        local_200 = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
        local_248 = &local_238;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_238 = *plVar9;
          lStack_230 = plVar5[3];
        }
        else {
          local_238 = *plVar9;
          local_248 = (long *)*plVar5;
        }
        local_240 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248);
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0],local_b0[0] + 1);
        }
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c0,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)local_c0);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_c0,(ulong)local_140._M_dataplus._M_p);
        local_100 = &local_f0;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_f0 = *plVar9;
          lStack_e8 = plVar5[3];
        }
        else {
          local_f0 = *plVar9;
          local_100 = (long *)*plVar5;
        }
        local_f8 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_120 = &local_110;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_110 = *plVar9;
          lStack_108 = plVar5[3];
        }
        else {
          local_110 = *plVar9;
          local_120 = (long *)*plVar5;
        }
        local_118 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_160.field_2._M_allocated_capacity = *psVar10;
          local_160.field_2._8_8_ = plVar5[3];
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar10;
          local_160._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_160._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_1a8.field_2._M_allocated_capacity = *puVar11;
          local_1a8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar11;
          local_1a8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1a8,(ulong)local_228._M_dataplus._M_p);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_1c8.field_2._M_allocated_capacity = *puVar11;
          local_1c8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *puVar11;
          local_1c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1c8._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        puVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_1e8.field_2._M_allocated_capacity = *puVar11;
          local_1e8.field_2._8_8_ = puVar7[3];
        }
        else {
          local_1e8.field_2._M_allocated_capacity = *puVar11;
          local_1e8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_1e8._M_string_length = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1e8,(ulong)local_140._M_dataplus._M_p);
        local_208 = &local_1f8;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar11) {
          local_1f8 = *puVar11;
          lStack_1f0 = plVar5[3];
        }
        else {
          local_1f8 = *puVar11;
          local_208 = (ulong *)*plVar5;
        }
        local_200 = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
        local_248 = &local_238;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_238 = *plVar9;
          lStack_230 = plVar5[3];
        }
        else {
          local_238 = *plVar9;
          local_248 = (long *)*plVar5;
        }
        local_240 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248);
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0],local_b0[0] + 1);
        }
        local_248 = &local_238;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        std::__cxx11::string::append((char *)&local_248);
        std::__cxx11::string::_M_append((char *)local_188,(ulong)local_248);
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        ppEVar8 = (local_98->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppEVar15 = ppEVar15 + 1;
    } while (ppEVar15 != ppEVar8);
  }
  paVar2 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_228);
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_228);
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_64 == '\0') goto LAB_00236ae0;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_1c8);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"o","");
  Namer::Variable(&local_1a8,local_60,&local_160,local_a0);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    uVar13 = local_1c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_1a8._M_string_length + local_1c8._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      uVar13 = local_1a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_1a8._M_string_length + local_1c8._M_string_length) goto LAB_0023689f;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1c8._M_dataplus._M_p);
  }
  else {
LAB_0023689f:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a8._M_dataplus._M_p);
  }
  puVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_1e8.field_2._M_allocated_capacity = *puVar11;
    local_1e8.field_2._8_8_ = puVar7[3];
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *puVar11;
    local_1e8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1e8._M_string_length = puVar7[1];
  *puVar7 = puVar11;
  puVar7[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_1f8 = *puVar11;
    lStack_1f0 = plVar5[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar11;
    local_208 = (ulong *)*plVar5;
  }
  local_200 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_140._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_238 = *plVar9;
    lStack_230 = plVar5[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar9;
    local_248 = (long *)*plVar5;
  }
  local_240 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar5[3];
    local_228._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_228._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_228._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
LAB_00236ae0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenUnionUnPack_ObjectAPI(const EnumDef &enum_def, std::string &code,
                                const std::string &type_name,
                                const std::string &field_name,
                                bool is_vector) const {
    const std::string variable_type =
        is_vector ? type_name.substr(0, type_name.length() - 2) : type_name;
    const std::string variable_name =
        "_" + namer_.Variable("o", field_name) + (is_vector ? "Element" : "");
    const std::string type_params = is_vector ? "_j" : "";
    const std::string value_params = is_vector ? ", _j" : "";
    const std::string indent = (is_vector ? "      " : "    ");

    code += indent + variable_type + " " + variable_name + " = new " +
            variable_type + "();\n";
    code += indent +
            GenTypeBasic(DestinationType(enum_def.underlying_type, false)) +
            " " + variable_name + "Type = " + field_name + "Type(" +
            type_params + ");\n";
    code += indent + variable_name + ".setType(" + variable_name + "Type);\n";
    code += indent + "Table " + variable_name + "Value;\n";
    code += indent + "switch (" + variable_name + "Type) {\n";
    for (auto eit = enum_def.Vals().begin(); eit != enum_def.Vals().end();
         ++eit) {
      auto &ev = **eit;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        continue;
      } else {
        if (ev.union_type.base_type == BASE_TYPE_STRING ||
            (ev.union_type.base_type == BASE_TYPE_STRUCT &&
             ev.union_type.struct_def->fixed)) {
          continue;  // This branch is due to bad implemantation of Unions in
                     // Java which doesn't handle non Table types. Should be
                     // deleted when issue #6561 is fixed.
        }
        code += indent + "  case " +
                Prefixed(namer_.NamespacedEnumVariant(enum_def, ev)) + ":\n";
        auto actual_type = GenTypeGet(ev.union_type);
        code += indent + "    " + variable_name + "Value = " + field_name +
                "(new " + actual_type + "()" + value_params + ");\n";
        code += indent + "    " + variable_name + ".setValue(" + variable_name +
                "Value != null ? ((" + actual_type + ") " + variable_name +
                "Value).unpack() : null);\n";
        code += indent + "    break;\n";
      }
    }
    code += indent + "  default: break;\n";
    code += indent + "}\n";
    if (is_vector) {
      code += indent + "_" + namer_.Variable("o", field_name) +
              "[_j] = " + variable_name + ";\n";
    }
  }